

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

void __thiscall LTFlightData::~LTFlightData(LTFlightData *this)

{
  pointer pcVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->dataAccessMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  DestroyAircraft(this);
  if (this->probeRef != (XPLMProbeRef)0x0) {
    XPLMDestroyProbe();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  FDStaticData::~FDStaticData(&this->statData);
  pcVar1 = (this->rwyId)._M_dataplus._M_p;
  paVar3 = &(this->rwyId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  std::_Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::
  ~_Deque_base(&(this->dynDataDeque).
                super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
              );
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posToAdd).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  pcVar1 = (this->labelStat)._M_dataplus._M_p;
  paVar3 = &(this->labelStat).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->acKey).key._M_dataplus._M_p;
  paVar3 = &(this->acKey).key.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

LTFlightData::~LTFlightData()
{
    try {
//        LOG_MSG(logDEBUG, "FD destroyed for %s", key().c_str());
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        // make sure aircraft is removed, too
        DestroyAircraft();
        // Release probe handle
        if (probeRef)
            XPLMDestroyProbe(probeRef);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}